

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Ed25519.c
# Opt level: O1

void Hacl_Impl_SHA2_512_update_last(uint64_t *state,uint8_t *data,uint64_t len)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong __n;
  uint8_t *__dest;
  long lVar5;
  uint8_t blocks [256];
  uint8_t local_138;
  ulong auStack_137 [32];
  
  uVar2 = 0;
  memset(&local_138,0,0x100);
  __dest = &local_138 + (ulong)(len < 0x70) * 0x80;
  __n = len & 0xffffffff;
  memcpy(__dest,data,__n);
  uVar1 = state[0xa8] * 0x400;
  uVar4 = len * 8 + uVar1;
  uVar3 = (len >> 0x3d) + (state[0xa8] >> 0x36) + (ulong)CARRY8(len * 8,uVar1);
  uVar1 = (ulong)(0x6fU - (int)len & 0x7f);
  __dest[__n] = 0x80;
  *(ulong *)(__dest + uVar1 + 1 + __n) = (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  *(ulong *)(__dest + uVar1 + 9 + __n) =
       uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
       (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
       (uVar4 & 0xff00) << 0x28 | len << 0x3b;
  lVar5 = 2 - (ulong)(len < 0x70);
  do {
    Hacl_Impl_SHA2_512_update(state,__dest + uVar2);
    uVar2 = uVar2 + 0x80;
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  return;
}

Assistant:

static void Hacl_Impl_SHA2_512_update_last(uint64_t *state, uint8_t *data, uint64_t len1)
{
  uint8_t blocks[256U] = { 0U };
  uint32_t nb;
  if (len1 < (uint64_t)112U)
    nb = (uint32_t)1U;
  else
    nb = (uint32_t)2U;
  uint8_t *final_blocks;
  if (len1 < (uint64_t)112U)
    final_blocks = blocks + (uint32_t)128U;
  else
    final_blocks = blocks;
  memcpy(final_blocks, data, (uint32_t)len1 * sizeof data[0U]);
  uint64_t n1 = state[168U];
  uint8_t *padding = final_blocks + (uint32_t)len1;
  FStar_UInt128_t
  encodedlen =
    FStar_UInt128_shift_left(FStar_UInt128_add(FStar_UInt128_mul_wide(n1, (uint64_t)(uint32_t)128U),
        FStar_UInt128_uint64_to_uint128(len1)),
      (uint32_t)3U);
  uint32_t
  pad0len = ((uint32_t)256U - ((uint32_t)len1 + (uint32_t)16U + (uint32_t)1U)) % (uint32_t)128U;
  uint8_t *buf1 = padding;
  uint8_t *buf2 = padding + (uint32_t)1U + pad0len;
  buf1[0U] = (uint8_t)0x80U;
  store128_be(buf2, encodedlen);
  Hacl_Impl_SHA2_512_update_multi(state, final_blocks, nb);
}